

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::CaseAssertionExpr::serializeTo(CaseAssertionExpr *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_type sVar2;
  AssertionExpr *__n;
  long lVar3;
  ItemGroup *item;
  pointer pIVar4;
  pointer pIVar5;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  pIVar4 = (this->items).data_;
  pIVar5 = pIVar4 + (this->items).size_;
  for (; pIVar4 != pIVar5; pIVar4 = pIVar4 + 1) {
    ASTSerializer::startObject(serializer);
    name_00._M_str = "expressions";
    name_00._M_len = 0xb;
    ASTSerializer::startArray(serializer,name_00);
    ppEVar1 = (pIVar4->expressions).data_;
    sVar2 = (pIVar4->expressions).size_;
    for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
    }
    ASTSerializer::endArray(serializer);
    __n = not_null<const_slang::ast::AssertionExpr_*>::get(&pIVar4->body);
    ASTSerializer::write(serializer,4,"body",(size_t)__n);
    ASTSerializer::endObject(serializer);
  }
  ASTSerializer::endArray(serializer);
  if (this->defaultCase != (AssertionExpr *)0x0) {
    ASTSerializer::write(serializer,0xb,"defaultCase",(size_t)this->defaultCase);
    return;
  }
  return;
}

Assistant:

void CaseAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);

    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();

        serializer.startArray("expressions");
        for (auto ex : item.expressions)
            serializer.serialize(*ex);
        serializer.endArray();

        serializer.write("body", *item.body);

        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase)
        serializer.write("defaultCase", *defaultCase);
}